

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool __thiscall
crnd::crn_unpacker::unpack_dxn
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  symbol_codec *this_00;
  vector<crnd::crn_unpacker::block_buffer_element> *this_01;
  uint uVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  byte bVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  uint8 *puVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  uint new_size;
  uint uVar14;
  block_buffer_element *pbVar15;
  long lVar16;
  uint uVar17;
  bool bVar18;
  uint local_c4;
  uint8 *local_a8;
  
  uVar1 = (this->m_alpha_endpoints).m_size;
  new_size = output_width + 1 & 0xfffffffe;
  this_01 = &this->m_block_buffer;
  if ((this->m_block_buffer).m_size < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(this_01,new_size);
  }
  this_00 = &this->m_codec;
  uVar10 = 0;
  uVar12 = 0;
  local_c4 = 0;
  uVar17 = 0;
  do {
    if ((this->m_pHeader->m_faces).m_buf[0] <= uVar10) {
      return true;
    }
    local_a8 = pDst[uVar10];
    for (uVar14 = 0; uVar14 != (output_height + 1 & 0xfffffffe); uVar14 = uVar14 + 1) {
      bVar18 = uVar14 < output_height;
      puVar8 = local_a8 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -4) * 4;
      uVar13 = 0;
      uVar9 = 0;
      for (lVar16 = 0; uVar11 = (uint)uVar12, (ulong)(output_width + 1 & 0xfffffffe) << 3 != lVar16;
          lVar16 = lVar16 + 8) {
        if (((uVar14 | uVar13) & 1) == 0) {
          uVar5 = symbol_codec::decode(this_00,&this->m_reference_encoding_dm);
          uVar12 = (ulong)uVar5;
          pbVar15 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar16);
LAB_0011215c:
          bVar4 = (byte)uVar12 & 3;
          pbVar15->endpoint_reference = (ushort)((byte)(uVar12 >> 2) & 3);
          uVar11 = (uint)(byte)((byte)uVar12 >> 4);
        }
        else {
          if ((uVar14 & 1) == 0) {
            pbVar15 = this_01->m_p + uVar9;
            goto LAB_0011215c;
          }
          pbVar15 = (block_buffer_element *)((long)&this_01->m_p->endpoint_reference + lVar16);
          bVar4 = (byte)pbVar15->endpoint_reference;
        }
        if (bVar4 == 1) {
          pbVar15->alpha0_endpoint_index = (uint16)uVar17;
          pbVar15->alpha1_endpoint_index = (uint16)local_c4;
        }
        else if (bVar4 == 0) {
          uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar6 = 0;
          if (uVar1 <= uVar5 + uVar17) {
            uVar6 = uVar1;
          }
          uVar17 = (uVar5 + uVar17) - uVar6;
          pbVar15->alpha0_endpoint_index = (uint16)uVar17;
          uVar5 = symbol_codec::decode(this_00,this->m_endpoint_delta_dm + 1);
          uVar6 = 0;
          if (uVar1 <= uVar5 + local_c4) {
            uVar6 = uVar1;
          }
          local_c4 = (uVar5 + local_c4) - uVar6;
          pbVar15->alpha1_endpoint_index = (uint16)local_c4;
        }
        else {
          uVar17 = (uint)pbVar15->alpha0_endpoint_index;
          local_c4 = (uint)pbVar15->alpha1_endpoint_index;
        }
        bVar18 = (bool)(bVar18 & uVar9 < output_width);
        uVar5 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        uVar7 = symbol_codec::decode(this_00,this->m_selector_delta_dm + 1);
        if (bVar18) {
          puVar2 = (this->m_alpha_endpoints).m_p;
          puVar3 = (this->m_alpha_selectors).m_p;
          *(uint *)(local_a8 + lVar16 * 2) = CONCAT22(puVar3[uVar5 * 3],puVar2[uVar17]);
          *(undefined4 *)(local_a8 + lVar16 * 2 + 4) =
               *(undefined4 *)(puVar3 + (ulong)(uVar5 * 3) + 1);
          *(uint *)(local_a8 + lVar16 * 2 + 8) = CONCAT22(puVar3[uVar7 * 3],puVar2[local_c4]);
          *(undefined4 *)(local_a8 + lVar16 * 2 + 0xc) =
               *(undefined4 *)(puVar3 + (ulong)(uVar7 * 3) + 1);
        }
        uVar9 = uVar9 + 1;
        uVar13 = uVar13 + 1;
        puVar8 = puVar8 + 0x10;
        uVar12 = (ulong)uVar11;
      }
      local_a8 = puVar8;
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

bool unpack_dxn(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height)
        {
            const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
            const uint32 width = (output_width + 1) & ~1;
            const uint32 height = (output_height + 1) & ~1;
            const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 2);

            if (m_block_buffer.size() < width)
                m_block_buffer.resize(width);

            uint32 alpha0_endpoint_index = 0;
            uint32 alpha1_endpoint_index = 0;
            uint8 reference_group = 0;

            for (uint32 f = 0; f < m_pHeader->m_faces; f++)
            {
                uint32* pData = (uint32*)pDst[f];
                for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords)
                {
                    bool visible = y < output_height;
                    for (uint32 x = 0; x < width; x++, pData += 4)
                    {
                        visible = visible && x < output_width;
                        if (!(y & 1) && !(x & 1))
                            reference_group = m_codec.decode(m_reference_encoding_dm);
                        block_buffer_element& buffer = m_block_buffer[x];
                        uint8 endpoint_reference;
                        if (y & 1)
                        {
                            endpoint_reference = buffer.endpoint_reference;
                        }
                        else
                        {
                            endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                            buffer.endpoint_reference = reference_group & 3;
                            reference_group >>= 2;
                        }
                        if (!endpoint_reference)
                        {
                            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha0_endpoint_index >= num_alpha_endpoints)
                                alpha0_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            alpha1_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
                            if (alpha1_endpoint_index >= num_alpha_endpoints)
                                alpha1_endpoint_index -= num_alpha_endpoints;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else if (endpoint_reference == 1)
                        {
                            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
                            buffer.alpha1_endpoint_index = alpha1_endpoint_index;
                        }
                        else
                        {
                            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
                            alpha1_endpoint_index = buffer.alpha1_endpoint_index;
                        }
                        uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        uint32 alpha1_selector_index = m_codec.decode(m_selector_delta_dm[1]);
                        if (visible)
                        {
                            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
                            const uint16* pAlpha1_selectors = &m_alpha_selectors[alpha1_selector_index * 3];
                            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
                            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
                            pData[2] = m_alpha_endpoints[alpha1_endpoint_index] | (pAlpha1_selectors[0] << 16);
                            pData[3] = pAlpha1_selectors[1] | (pAlpha1_selectors[2] << 16);
                        }
                    }
                }
            }
            return true;
        }